

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall Assimp::FBX::Node::AddP70bool(Node *this,string *name,bool value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator local_b1;
  string local_b0;
  undefined1 local_90 [8];
  Node n;
  bool value_local;
  string *name_local;
  Node *this_local;
  
  n.property_start._7_1_ = value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"P",&local_b1);
  Node((Node *)local_90,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::string((string *)&local_e8,(string *)name);
  AddProperties<std::__cxx11::string,char_const*,char_const*,char_const*,int>
            ((Node *)local_90,&local_e8,"bool","","",n.property_start._7_1_ & 1);
  std::__cxx11::string::~string((string *)&local_e8);
  AddChild(this,(Node *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void FBX::Node::AddP70bool(
    const std::string& name, bool value
) {
    FBX::Node n("P");
    n.AddProperties(name, "bool", "", "", int32_t(value));
    AddChild(n);
}